

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

bool __thiscall TTD::ExecutionInfoManager::TryFindAndSetPreviousBP(ExecutionInfoManager *this)

{
  bool bVar1;
  ExecutionInfoManager *this_local;
  
  bVar1 = TTDebuggerSourceLocation::HasValue(&this->m_continueBreakPoint);
  if (bVar1) {
    TTDebuggerSourceLocation::SetLocationCopy(&this->m_pendingTTDBP,&this->m_continueBreakPoint);
    TTDebuggerSourceLocation::Clear(&this->m_continueBreakPoint);
  }
  return bVar1;
}

Assistant:

bool ExecutionInfoManager::TryFindAndSetPreviousBP()
    {
        if(!this->m_continueBreakPoint.HasValue())
        {
            return false;
        }
        else
        {
            this->m_pendingTTDBP.SetLocationCopy(this->m_continueBreakPoint);
            this->m_continueBreakPoint.Clear();

            return true;
        }
    }